

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O2

void __thiscall
Apple::ADB::ReactiveDevice::ReactiveDevice(ReactiveDevice *this,Bus *bus,uint8_t adb_device_id)

{
  size_t sVar1;
  
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_adb_bus_did_observe_event_0057e088;
  this->bus_ = bus;
  sVar1 = Bus::add_device(bus,&this->super_Device);
  this->device_id_ = sVar1;
  this->microseconds_at_bit_ = 0.0;
  this->phase_ = AwaitingAttention;
  (this->response_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->response_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->response_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->response_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->expected_content_size_ = 0;
  (this->command_).type = Reserved;
  (this->command_).device = 0xff;
  (this->command_).reg = 0xff;
  this->stop_has_begin_ = false;
  this->default_adb_device_id_ = adb_device_id;
  (this->service_desired_)._M_base._M_i = false;
  this->register3_ = (ushort)adb_device_id << 8 | 0x6001;
  return;
}

Assistant:

ReactiveDevice::ReactiveDevice(Apple::ADB::Bus &bus, uint8_t adb_device_id) :
	bus_(bus),
	device_id_(bus.add_device(this)),
	default_adb_device_id_(adb_device_id) {
	reset();
}